

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O1

void __thiscall duckdb::CSVErrorHandler::Insert(CSVErrorHandler *this,idx_t boundary_idx,idx_t rows)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  _Hash_node_base *local_30;
  LinesPerBoundary local_28;
  
  local_30 = (_Hash_node_base *)boundary_idx;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  uVar1 = (this->lines_per_batch_map)._M_h._M_bucket_count;
  uVar5 = (ulong)local_30 % uVar1;
  p_Var6 = (this->lines_per_batch_map)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, local_30 != p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, local_30 == p_Var2[1]._M_nxt)) goto LAB_016a71f0;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_016a71f0:
  if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
    LinesPerBoundary::LinesPerBoundary(&local_28,(idx_t)local_30,rows);
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->lines_per_batch_map,(key_type *)&local_30);
    pmVar4->boundary_idx = local_28.boundary_idx;
    pmVar4->lines_in_batch = local_28.lines_in_batch;
  }
  else {
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->lines_per_batch_map,(key_type *)&local_30);
    pmVar4->lines_in_batch = pmVar4->lines_in_batch + rows;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void CSVErrorHandler::Insert(idx_t boundary_idx, idx_t rows) {
	lock_guard<mutex> parallel_lock(main_mutex);
	if (lines_per_batch_map.find(boundary_idx) == lines_per_batch_map.end()) {
		lines_per_batch_map[boundary_idx] = {boundary_idx, rows};
	} else {
		lines_per_batch_map[boundary_idx].lines_in_batch += rows;
	}
}